

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Expr * substExpr(SubstContext *pSubst,Expr *pExpr)

{
  byte *pbVar1;
  short sVar2;
  Window *pWVar3;
  sqlite3 *db;
  int iVar4;
  Expr *pEVar5;
  CollSeq *pCVar6;
  CollSeq *pCVar7;
  uint uVar8;
  char *zC;
  Expr *p;
  Expr ifNullRow;
  
  if (pExpr == (Expr *)0x0) {
    return (Expr *)0x0;
  }
  if (((pExpr->flags & 3) != 0) && ((pExpr->w).iJoin == pSubst->iTable)) {
    pExpr->w = (anon_union_4_2_009eaf8f_for_w)pSubst->iNewTable;
  }
  if (pExpr->op == 0xb3) {
    if (pExpr->iTable == pSubst->iTable) {
      pExpr->iTable = pSubst->iNewTable;
    }
  }
  else if (((pExpr->op == 0xa7) && ((pExpr->flags & 0x20) == 0)) &&
          (pExpr->iTable == pSubst->iTable)) {
    sVar2 = pExpr->iColumn;
    pEVar5 = pSubst->pEList->a[sVar2].pExpr;
    iVar4 = sqlite3ExprIsVector(pEVar5);
    if (iVar4 != 0) {
      sqlite3VectorErrorMsg(pSubst->pParse,pEVar5);
      return pExpr;
    }
    db = pSubst->pParse->db;
    p = pEVar5;
    if (pSubst->isOuterJoin != 0) {
      if (pEVar5->op == 0xa7) {
        uVar8 = pSubst->iNewTable;
        if (pEVar5->iTable == uVar8) goto LAB_001781b4;
      }
      else {
        uVar8 = pSubst->iNewTable;
      }
      ifNullRow.u.zToken = (char *)0x0;
      ifNullRow.pRight = (Expr *)0x0;
      ifNullRow.y.pTab = (Table *)0x0;
      ifNullRow.x.pList = (ExprList *)0x0;
      ifNullRow.pAggInfo = (AggInfo *)0x0;
      ifNullRow._40_8_ = (ulong)uVar8 << 0x20;
      ifNullRow.iColumn = -99;
      ifNullRow.iAgg = 0;
      ifNullRow.w = (anon_union_4_2_009eaf8f_for_w)0x0;
      ifNullRow.op = 0xb3;
      ifNullRow.affExpr = '\0';
      ifNullRow.op2 = '\0';
      ifNullRow._3_1_ = 0;
      ifNullRow.flags = 0x40000;
      p = &ifNullRow;
      ifNullRow.pLeft = pEVar5;
    }
LAB_001781b4:
    pEVar5 = sqlite3ExprDup(db,p,0);
    if (db->mallocFailed == '\0') {
      if (pSubst->isOuterJoin != 0) {
        pbVar1 = (byte *)((long)&pEVar5->flags + 2);
        *pbVar1 = *pbVar1 | 0x20;
      }
      uVar8 = pExpr->flags & 3;
      if (uVar8 != 0) {
        sqlite3SetJoinExpr(pEVar5,(pExpr->w).iJoin,uVar8);
      }
      sqlite3ExprDeleteNN(db,pExpr);
      if (pEVar5->op == 0xaa) {
        iVar4 = sqlite3ExprTruthValue(pEVar5);
        (pEVar5->u).iValue = iVar4;
        pEVar5->op = 0x9b;
        pbVar1 = (byte *)((long)&pEVar5->flags + 1);
        *pbVar1 = *pbVar1 | 8;
      }
      pCVar6 = sqlite3ExprCollSeq(pSubst->pParse,pEVar5);
      pCVar7 = sqlite3ExprCollSeq(pSubst->pParse,pSubst->pCList->a[sVar2].pExpr);
      if ((pCVar6 != pCVar7) || ((pEVar5->op != 'q' && (pEVar5->op != 0xa7)))) {
        if (pCVar7 == (CollSeq *)0x0) {
          zC = "BINARY";
        }
        else {
          zC = pCVar7->zName;
        }
        pEVar5 = sqlite3ExprAddCollateString(pSubst->pParse,pEVar5,zC);
      }
      pbVar1 = (byte *)((long)&pEVar5->flags + 1);
      *pbVar1 = *pbVar1 & 0xfd;
      return pEVar5;
    }
    sqlite3ExprDelete(db,pEVar5);
    return pExpr;
  }
  pEVar5 = substExpr(pSubst,pExpr->pLeft);
  pExpr->pLeft = pEVar5;
  pEVar5 = substExpr(pSubst,pExpr->pRight);
  pExpr->pRight = pEVar5;
  if ((pExpr->flags & 0x1000) == 0) {
    substExprList(pSubst,(pExpr->x).pList);
  }
  else {
    substSelect(pSubst,(Select *)(pExpr->x).pList,1);
  }
  if ((pExpr->flags & 0x1000000) != 0) {
    pWVar3 = (pExpr->y).pWin;
    pEVar5 = substExpr(pSubst,pWVar3->pFilter);
    pWVar3->pFilter = pEVar5;
    substExprList(pSubst,pWVar3->pPartition);
    substExprList(pSubst,pWVar3->pOrderBy);
  }
  return pExpr;
}

Assistant:

static Expr *substExpr(
  SubstContext *pSubst,  /* Description of the substitution */
  Expr *pExpr            /* Expr in which substitution occurs */
){
  if( pExpr==0 ) return 0;
  if( ExprHasProperty(pExpr, EP_OuterON|EP_InnerON)
   && pExpr->w.iJoin==pSubst->iTable
  ){
    testcase( ExprHasProperty(pExpr, EP_InnerON) );
    pExpr->w.iJoin = pSubst->iNewTable;
  }
  if( pExpr->op==TK_COLUMN
   && pExpr->iTable==pSubst->iTable
   && !ExprHasProperty(pExpr, EP_FixedCol)
  ){
#ifdef SQLITE_ALLOW_ROWID_IN_VIEW
    if( pExpr->iColumn<0 ){
      pExpr->op = TK_NULL;
    }else
#endif
    {
      Expr *pNew;
      int iColumn;
      Expr *pCopy;
      Expr ifNullRow;
      iColumn = pExpr->iColumn;
      assert( iColumn>=0 );
      assert( pSubst->pEList!=0 && iColumn<pSubst->pEList->nExpr );
      assert( pExpr->pRight==0 );
      pCopy = pSubst->pEList->a[iColumn].pExpr;
      if( sqlite3ExprIsVector(pCopy) ){
        sqlite3VectorErrorMsg(pSubst->pParse, pCopy);
      }else{
        sqlite3 *db = pSubst->pParse->db;
        if( pSubst->isOuterJoin
         && (pCopy->op!=TK_COLUMN || pCopy->iTable!=pSubst->iNewTable)
        ){
          memset(&ifNullRow, 0, sizeof(ifNullRow));
          ifNullRow.op = TK_IF_NULL_ROW;
          ifNullRow.pLeft = pCopy;
          ifNullRow.iTable = pSubst->iNewTable;
          ifNullRow.iColumn = -99;
          ifNullRow.flags = EP_IfNullRow;
          pCopy = &ifNullRow;
        }
        testcase( ExprHasProperty(pCopy, EP_Subquery) );
        pNew = sqlite3ExprDup(db, pCopy, 0);
        if( db->mallocFailed ){
          sqlite3ExprDelete(db, pNew);
          return pExpr;
        }
        if( pSubst->isOuterJoin ){
          ExprSetProperty(pNew, EP_CanBeNull);
        }
        if( ExprHasProperty(pExpr,EP_OuterON|EP_InnerON) ){
          sqlite3SetJoinExpr(pNew, pExpr->w.iJoin,
                             pExpr->flags & (EP_OuterON|EP_InnerON));
        }
        sqlite3ExprDelete(db, pExpr);
        pExpr = pNew;
        if( pExpr->op==TK_TRUEFALSE ){
          pExpr->u.iValue = sqlite3ExprTruthValue(pExpr);
          pExpr->op = TK_INTEGER;
          ExprSetProperty(pExpr, EP_IntValue);
        }

        /* Ensure that the expression now has an implicit collation sequence,
        ** just as it did when it was a column of a view or sub-query. */
        {
          CollSeq *pNat = sqlite3ExprCollSeq(pSubst->pParse, pExpr);
          CollSeq *pColl = sqlite3ExprCollSeq(pSubst->pParse,
                pSubst->pCList->a[iColumn].pExpr
          );
          if( pNat!=pColl || (pExpr->op!=TK_COLUMN && pExpr->op!=TK_COLLATE) ){
            pExpr = sqlite3ExprAddCollateString(pSubst->pParse, pExpr,
                (pColl ? pColl->zName : "BINARY")
            );
          }
        }
        ExprClearProperty(pExpr, EP_Collate);
      }
    }
  }else{
    if( pExpr->op==TK_IF_NULL_ROW && pExpr->iTable==pSubst->iTable ){
      pExpr->iTable = pSubst->iNewTable;
    }
    pExpr->pLeft = substExpr(pSubst, pExpr->pLeft);
    pExpr->pRight = substExpr(pSubst, pExpr->pRight);
    if( ExprUseXSelect(pExpr) ){
      substSelect(pSubst, pExpr->x.pSelect, 1);
    }else{
      substExprList(pSubst, pExpr->x.pList);
    }
#ifndef SQLITE_OMIT_WINDOWFUNC
    if( ExprHasProperty(pExpr, EP_WinFunc) ){
      Window *pWin = pExpr->y.pWin;
      pWin->pFilter = substExpr(pSubst, pWin->pFilter);
      substExprList(pSubst, pWin->pPartition);
      substExprList(pSubst, pWin->pOrderBy);
    }
#endif
  }
  return pExpr;
}